

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

int xmlValidateNCName(xmlChar *value,int space)

{
  byte bVar1;
  undefined4 in_EAX;
  uint uVar2;
  int iVar3;
  uint uVar4;
  byte *pbVar5;
  xmlChar *cur;
  int l;
  undefined8 local_38;
  
  if (value == (xmlChar *)0x0) {
    return -1;
  }
  pbVar5 = value;
  if (space != 0) {
    while (((ulong)*pbVar5 < 0x21 && ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) != 0))) {
      pbVar5 = pbVar5 + 1;
    }
  }
  bVar1 = *pbVar5;
  if (((byte)(bVar1 + 0x9f) < 0x1a) || (bVar1 == 0x5f || (byte)(bVar1 + 0xbf) < 0x1a)) {
    do {
      do {
        pbVar5 = pbVar5 + 1;
        bVar1 = *pbVar5;
      } while ((byte)(bVar1 - 0x30) < 10);
    } while (((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a) ||
            ((bVar1 - 0x2d < 0x33 && ((0x4000000000003U >> ((ulong)(bVar1 - 0x2d) & 0x3f) & 1) != 0)
             )));
    if (space != 0) {
      while (((ulong)*pbVar5 < 0x21 && ((0x100002600U >> ((ulong)*pbVar5 & 0x3f) & 1) != 0))) {
        pbVar5 = pbVar5 + 1;
      }
    }
    if (*pbVar5 == 0) {
      return 0;
    }
  }
  local_38 = CONCAT44(space,in_EAX);
  uVar2 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,(int *)&local_38);
  if ((int)uVar2 < 0x100 && space != 0) {
    do {
      if ((0x20 < uVar2) || ((0x100002600U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) break;
      value = value + (int)local_38;
      uVar2 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,(int *)&local_38);
    } while ((int)uVar2 < 0x100);
  }
  if ((int)uVar2 < 0x100) {
    if (((uVar2 - 0xc0 < 0x17) || ((uVar2 & 0xffffffdf) - 0x41 < 0x1a)) ||
       (0xf7 < (int)uVar2 || uVar2 - 0xd8 < 0x1f)) goto LAB_0014868e;
  }
  else {
    iVar3 = xmlCharInRange(uVar2,&xmlIsBaseCharGroup);
    if (iVar3 != 0) goto LAB_0014868e;
  }
  if ((int)uVar2 < 0x100) {
    if (uVar2 != 0x5f) {
      return 1;
    }
  }
  else if ((uVar2 - 0x302a < 0xfffffff7 && uVar2 - 0x9fa6 < 0xffffae5a) && uVar2 != 0x3007) {
    return 1;
  }
LAB_0014868e:
  value = value + (int)local_38;
  uVar2 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,(int *)&local_38);
  if ((int)uVar2 < 0x100) {
    if (((uVar2 - 0xc0 < 0x17) || ((uVar2 & 0xffffffdf) - 0x41 < 0x1a)) ||
       (0xf7 < (int)uVar2 || uVar2 - 0xd8 < 0x1f)) goto LAB_0014868e;
  }
  else {
    iVar3 = xmlCharInRange(uVar2,&xmlIsBaseCharGroup);
    if (iVar3 != 0) goto LAB_0014868e;
  }
  if ((int)uVar2 < 0x100) {
    if (uVar2 - 0x30 < 10) goto LAB_0014868e;
  }
  else if (((uVar2 - 0x3021 < 9 || uVar2 - 0x4e00 < 0x51a6) || uVar2 == 0x3007) ||
          (iVar3 = xmlCharInRange(uVar2,&xmlIsDigitGroup), iVar3 != 0)) goto LAB_0014868e;
  if ((0x32 < uVar2 - 0x2d) || ((0x4000000000003U >> ((ulong)(uVar2 - 0x2d) & 0x3f) & 1) == 0)) {
    if ((int)uVar2 < 0x100) {
      uVar4 = (uint)(uVar2 == 0xb7);
    }
    else {
      iVar3 = xmlCharInRange(uVar2,&xmlIsCombiningGroup);
      if (iVar3 != 0) goto LAB_0014868e;
      uVar4 = xmlCharInRange(uVar2,&xmlIsExtenderGroup);
    }
    if (uVar4 == 0) {
      if (local_38._4_4_ != 0) {
        while ((((int)uVar2 < 0x100 && (uVar2 < 0x21)) &&
               ((0x100002600U >> ((ulong)uVar2 & 0x3f) & 1) != 0))) {
          value = value + (int)local_38;
          uVar2 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,(int *)&local_38);
        }
      }
      return (uint)(uVar2 != 0);
    }
  }
  goto LAB_0014868e;
}

Assistant:

int
xmlValidateNCName(const xmlChar *value, int space) {
    const xmlChar *cur = value;
    int c,l;

    if (value == NULL)
        return(-1);

    /*
     * First quick algorithm for ASCII range
     */
    if (space)
	while (IS_BLANK_CH(*cur)) cur++;
    if (((*cur >= 'a') && (*cur <= 'z')) || ((*cur >= 'A') && (*cur <= 'Z')) ||
	(*cur == '_'))
	cur++;
    else
	goto try_complex;
    while (((*cur >= 'a') && (*cur <= 'z')) ||
	   ((*cur >= 'A') && (*cur <= 'Z')) ||
	   ((*cur >= '0') && (*cur <= '9')) ||
	   (*cur == '_') || (*cur == '-') || (*cur == '.'))
	cur++;
    if (space)
	while (IS_BLANK_CH(*cur)) cur++;
    if (*cur == 0)
	return(0);

try_complex:
    /*
     * Second check for chars outside the ASCII range
     */
    cur = value;
    c = CUR_SCHAR(cur, l);
    if (space) {
	while (IS_BLANK(c)) {
	    cur += l;
	    c = CUR_SCHAR(cur, l);
	}
    }
    if ((!IS_LETTER(c)) && (c != '_'))
	return(1);
    cur += l;
    c = CUR_SCHAR(cur, l);
    while (IS_LETTER(c) || IS_DIGIT(c) || (c == '.') ||
	   (c == '-') || (c == '_') || IS_COMBINING(c) ||
	   IS_EXTENDER(c)) {
	cur += l;
	c = CUR_SCHAR(cur, l);
    }
    if (space) {
	while (IS_BLANK(c)) {
	    cur += l;
	    c = CUR_SCHAR(cur, l);
	}
    }
    if (c != 0)
	return(1);

    return(0);
}